

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O1

void __thiscall
TasGrid::Optimizer::CurrentNodes<(TasGrid::TypeOneDRule)15>::~CurrentNodes
          (CurrentNodes<(TasGrid::TypeOneDRule)15> *this)

{
  pointer pdVar1;
  
  pdVar1 = (this->coeff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->coeff).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->nodes).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
    return;
  }
  return;
}

Assistant:

CurrentNodes(std::vector<double> const &cnodes)
        : nodes(cnodes), coeff(makeCoefficients(cnodes)){}